

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_end_utt(fe_t *fe,mfcc_t *cepvector,int32 *nframes)

{
  int32 *nframes_local;
  mfcc_t *cepvector_local;
  fe_t *fe_local;
  
  if (fe->num_overflow_samps < 1) {
    *nframes = 0;
  }
  else {
    fe_read_frame_int16(fe,fe->overflow_samps,fe->num_overflow_samps);
    fe_write_frame(fe,cepvector);
    *nframes = 1;
  }
  fe->num_overflow_samps = 0;
  return 0;
}

Assistant:

int32
fe_end_utt(fe_t * fe, mfcc_t * cepvector, int32 * nframes)
{
    /* Process any remaining data. */
    if (fe->num_overflow_samps > 0) {
        fe_read_frame_int16(fe, fe->overflow_samps,
                            fe->num_overflow_samps);
        fe_write_frame(fe, cepvector);
        *nframes = 1;
    }
    else {
        *nframes = 0;
    }

    /* reset overflow buffers... */
    fe->num_overflow_samps = 0;

    return 0;
}